

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

bool getVariableKktFailures
               (double primal_feasibility_tolerance,double dual_feasibility_tolerance,double lower,
               double upper,double value,double dual,HighsBasisStatus *status_pointer,
               HighsVarType integrality,double *absolute_primal_infeasibility,
               double *relative_primal_infeasibility,double *dual_infeasibility,
               double *value_residual)

{
  double *pdVar1;
  double *in_RCX;
  double *in_RDX;
  char in_SIL;
  char *in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double middle;
  bool at_a_bound;
  bool status_value_ok;
  bool local_a2;
  bool local_a1;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  bool local_79;
  double local_78;
  double local_70;
  bool local_61;
  double *local_60;
  double *local_58;
  char *local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_8;
  
  local_61 = true;
  *in_RDX = 0.0;
  *in_RCX = 0.0;
  if (in_XMM2_Qa - in_XMM0_Qa <= in_XMM4_Qa) {
    if (in_XMM3_Qa + in_XMM0_Qa < in_XMM4_Qa) {
      *in_RDX = in_XMM4_Qa - in_XMM3_Qa;
      *in_RCX = *in_RDX / (ABS(in_XMM3_Qa) + 1.0);
    }
  }
  else {
    *in_RDX = in_XMM2_Qa - in_XMM4_Qa;
    *in_RCX = *in_RDX / (ABS(in_XMM2_Qa) + 1.0);
  }
  if ((0.0 < *in_RDX) &&
     (((in_SIL == '\x02' || (in_SIL == '\x03')) && (ABS(in_XMM4_Qa) < in_XMM0_Qa)))) {
    *in_RDX = 0.0;
    *in_RCX = 0.0;
  }
  local_70 = ABS(in_XMM2_Qa - in_XMM4_Qa);
  local_78 = ABS(in_XMM4_Qa - in_XMM3_Qa);
  local_60 = in_R9;
  local_58 = in_R8;
  local_38 = in_RDI;
  local_30 = in_XMM5_Qa;
  local_28 = in_XMM4_Qa;
  local_20 = in_XMM3_Qa;
  local_18 = in_XMM2_Qa;
  local_8 = in_XMM0_Qa;
  pdVar1 = std::min<double>(&local_70,&local_78);
  *local_60 = *pdVar1;
  local_79 = *local_60 <= local_8;
  if (local_38 != (char *)0x0) {
    local_79 = *local_38 != '\x01' && local_79;
    if (*local_38 == '\0') {
      if (ABS(local_18) / local_8 < 1e-16) {
        local_a1 = local_18 - local_8 <= local_28 && local_28 <= local_18 + local_8;
        local_61 = local_a1;
      }
    }
    else if ((*local_38 == '\x02') && (ABS(local_20) / local_8 < 1e-16)) {
      local_a2 = local_20 - local_8 <= local_28 && local_28 <= local_20 + local_8;
      local_61 = local_a2;
    }
  }
  if (local_79 == false) {
    *local_58 = ABS(local_30);
  }
  else {
    local_88 = (local_18 + local_20) * 0.5;
    if (local_20 <= local_18) {
      *local_58 = 0.0;
    }
    else if (local_88 <= local_28) {
      local_a0 = 0.0;
      pdVar1 = std::max<double>(&local_30,&local_a0);
      *local_58 = *pdVar1;
    }
    else {
      local_90 = -local_30;
      local_98 = 0.0;
      pdVar1 = std::max<double>(&local_90,&local_98);
      *local_58 = *pdVar1;
    }
  }
  return (bool)(local_61 & 1);
}

Assistant:

bool getVariableKktFailures(const double primal_feasibility_tolerance,
                            const double dual_feasibility_tolerance,
                            const double lower, const double upper,
                            const double value, const double dual,
                            const HighsBasisStatus* status_pointer,
                            const HighsVarType integrality,
                            double& absolute_primal_infeasibility,
                            double& relative_primal_infeasibility,
                            double& dual_infeasibility,
                            double& value_residual) {
  bool status_value_ok = true;
  // @primal_infeasibility calculation
  absolute_primal_infeasibility = 0;
  relative_primal_infeasibility = 0;
  if (value < lower - primal_feasibility_tolerance) {
    // Below lower
    absolute_primal_infeasibility = lower - value;
    relative_primal_infeasibility =
        absolute_primal_infeasibility / (1 + std::fabs(lower));
  } else if (value > upper + primal_feasibility_tolerance) {
    // Above upper
    absolute_primal_infeasibility = value - upper;
    relative_primal_infeasibility =
        absolute_primal_infeasibility / (1 + std::fabs(upper));
  }
  // Account for semi-variables
  if (absolute_primal_infeasibility > 0 &&
      (integrality == HighsVarType::kSemiContinuous ||
       integrality == HighsVarType::kSemiInteger) &&
      std::fabs(value) < primal_feasibility_tolerance) {
    absolute_primal_infeasibility = 0;
    relative_primal_infeasibility = 0;
  }
  value_residual = std::min(std::fabs(lower - value), std::fabs(value - upper));
  // Determine whether the variable is at a bound using the basis
  // status (if valid) or value residual.
  bool at_a_bound = value_residual <= primal_feasibility_tolerance;
  if (status_pointer != NULL) {
    // If the variable is basic, then consider it not to be at a bound
    // so that any dual value yields an infeasibility value
    if (*status_pointer == HighsBasisStatus::kBasic) at_a_bound = false;
    // With very large values, accuracy is lost in adding/subtracting
    // the feasibility tolerance from the bounds, so skip if this may
    // occur
    //
    // Check that kLower and kUpper are consistent with value and
    // bounds - for debugging QP basis errors
    if (*status_pointer == HighsBasisStatus::kLower) {
      if (std::fabs(lower) / primal_feasibility_tolerance < 1e-16)
        status_value_ok = value >= lower - primal_feasibility_tolerance &&
                          value <= lower + primal_feasibility_tolerance;
    } else if (*status_pointer == HighsBasisStatus::kUpper) {
      if (std::fabs(upper) / primal_feasibility_tolerance < 1e-16)
        status_value_ok = value >= upper - primal_feasibility_tolerance &&
                          value <= upper + primal_feasibility_tolerance;
    }
  }
  if (at_a_bound) {
    // At a bound
    double middle = (lower + upper) * 0.5;
    if (lower < upper) {
      // Non-fixed variable
      if (value < middle) {
        // At lower
        dual_infeasibility = std::max(-dual, 0.);
      } else {
        // At upper
        dual_infeasibility = std::max(dual, 0.);
      }
    } else {
      // Fixed variable
      dual_infeasibility = 0;
    }
  } else {
    // Off bounds (or free)
    dual_infeasibility = fabs(dual);
  }
  return status_value_ok;
}